

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_TAP_UNLIFE(effect_handler_context_t *context)

{
  effect_handler_context_t *peVar1;
  _Bool _Var2;
  monster *mon_00;
  char *dice_string;
  source origin;
  wchar_t local_94;
  _Bool local_8d;
  uint local_8c;
  char local_88 [2];
  _Bool dead;
  _Bool fear;
  wchar_t drain;
  char m_name [80];
  monster *mon;
  loc_conflict target;
  wchar_t amount;
  effect_handler_context_t *context_local;
  
  unique0x10000226 = context;
  target.x = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  local_8c = 0;
  local_8d = false;
  stack0xffffffffffffffe8->ident = true;
  _Var2 = target_set_closest(L'\x01',monster_is_undead);
  if (_Var2) {
    target_get((loc *)((long)&mon + 4));
    mon_00 = target_get_monster();
    if (target.x < mon_00->hp) {
      local_94 = target.x;
    }
    else {
      local_94 = (wchar_t)mon_00->hp;
    }
    local_8c = local_94 / 4;
    monster_desc(local_88,0x50,mon_00,L'\x15');
    if (((player->opts).opt[3] & 1U) == 0) {
      msg("You draw power from the %s.",local_88);
    }
    else {
      msg("You draw power from the %s. (%d)",local_88,(ulong)(uint)target.x);
    }
    _Var2 = mon_take_hit(mon_00,player,target.x,&local_8d," is destroyed!");
    peVar1 = stack0xffffffffffffffe8;
    dice_string = format("%d",(ulong)local_8c);
    origin._4_4_ = 0;
    origin.what = (peVar1->origin).what;
    origin.which.trap = (peVar1->origin).which.trap;
    effect_simple(L'\x18',origin,dice_string,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    if (_Var2) {
      target_set_location(L'\0',L'\0');
    }
    else {
      _Var2 = monster_is_visible(mon_00);
      if ((_Var2) && (message_pain(mon_00,target.x), (local_8d & 1U) != 0)) {
        add_monster_message(mon_00,L'%',true);
      }
    }
    context_local._7_1_ = true;
  }
  else {
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_TAP_UNLIFE(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	struct loc target;
	struct monster *mon = NULL;
	char m_name[80];
	int drain = 0;
	bool fear = false;
	bool dead = false;

	context->ident = true;

	/* Closest living monster */
	if (!target_set_closest(TARGET_KILL, monster_is_undead)) {
		return false;
	}
	target_get(&target);
	mon = target_get_monster();

	/* Hurt the monster */
	drain = MIN(mon->hp, amount) / 4;
	monster_desc(m_name, sizeof(m_name), mon, MDESC_TARG);
	if (OPT(player, show_damage)) {
		msg("You draw power from the %s. (%d)", m_name, amount);
	} else {
		msg("You draw power from the %s.", m_name);
	}
	dead = mon_take_hit(mon, player, amount, &fear, " is destroyed!");

	/* Gain mana */
	effect_simple(EF_RESTORE_MANA, context->origin, format("%d", drain), 0, 0,
				  0, 0, 0, NULL);

	if (dead) {
		/* Cancel the targeting of the dead creature. */
		target_set_location(0, 0);
	} else if (monster_is_visible(mon)) {
		/* Handle fear for surviving monsters */
		message_pain(mon, amount);
		if (fear) {
			add_monster_message(mon, MON_MSG_FLEE_IN_TERROR, true);
		}
	}

	return true;
}